

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void ar_summary(ar_object obj)

{
  double *pdVar1;
  ulong uVar2;
  
  puts("\n");
  printf(" AR Order : ( %d) \n",(ulong)(uint)obj->p);
  putchar(10);
  printf("%-20s%-20s \n\n","Coefficients","Value");
  if (0 < obj->p) {
    uVar2 = 0;
    do {
      pdVar1 = obj->phi + uVar2;
      uVar2 = uVar2 + 1;
      printf("AR%-15d%-20g \n",*pdVar1,uVar2 & 0xffffffff);
    } while ((long)uVar2 < (long)obj->p);
  }
  putchar(10);
  printf("%-17s%-20g \n",obj->mean,"MEAN");
  putchar(10);
  printf("%-17s%-20g \n",obj->var,"SIGMA^2");
  putchar(10);
  printf("ESTIMATION METHOD : ");
  if ((ulong)(uint)obj->method < 3) {
    printf(&DAT_00153180 + *(int *)(&DAT_00153180 + (ulong)(uint)obj->method * 4));
  }
  puts("\n");
  return;
}

Assistant:

void ar_summary(ar_object obj) {
	int i;

	printf("\n\n");
	printf(" AR Order : ( %d) \n", obj->p);
	printf("\n");
	printf("%-20s%-20s \n\n", "Coefficients", "Value");
	for (i = 0; i < obj->p; ++i) {
		printf("AR%-15d%-20g \n", i + 1, obj->phi[i]);
	}
	printf("\n");
	
	printf("%-17s%-20g \n", "MEAN", obj->mean);
	
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->var);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->method == 0) {
		printf("Yule Walker");
	}
	else if (obj->method == 1) {
		printf("Burg");
	}
	else if (obj->method == 2) {
		printf("MLE");
	}
	printf("\n\n");
}